

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

_Bool menu_calc_size(menu *menu)

{
  int iVar1;
  size_t sVar2;
  region rVar3;
  bool local_31;
  undefined4 uStack_20;
  int offset;
  undefined8 local_18;
  menu *menu_local;
  
  rVar3 = region_calculate(menu->boundary);
  _uStack_20 = rVar3._0_8_;
  (menu->active).col = uStack_20;
  (menu->active).row = offset;
  local_18 = rVar3._8_8_;
  (menu->active).width = (undefined4)local_18;
  (menu->active).page_rows = local_18._4_4_;
  if (menu->title != (char *)0x0) {
    (menu->active).row = (menu->active).row + 2;
    (menu->active).page_rows = (menu->active).page_rows + -2;
    (menu->active).col = (menu->active).col + 4;
  }
  if (menu->header != (char *)0x0) {
    (menu->active).row = (menu->active).row + 1;
    (menu->active).page_rows = (menu->active).page_rows + -1;
  }
  if (menu->prompt != (char *)0x0) {
    if ((menu->active).page_rows < 2) {
      sVar2 = strlen(menu->prompt);
      iVar1 = (int)sVar2 + 2;
      (menu->active).col = iVar1 + (menu->active).col;
      (menu->active).width = (menu->active).width - iVar1;
    }
    else {
      (menu->active).page_rows = (menu->active).page_rows + -1;
    }
  }
  local_31 = false;
  if (0 < (menu->active).width) {
    local_31 = 0 < (menu->active).page_rows;
  }
  return local_31;
}

Assistant:

static bool menu_calc_size(struct menu *menu)
{
	/* Calculate term-relative positions */
	menu->active = region_calculate(menu->boundary);

	if (menu->title) {
		menu->active.row += 2;
		menu->active.page_rows -= 2;
		menu->active.col += 4;
	}

	if (menu->header) {
		menu->active.row++;
		menu->active.page_rows--;
	}

	if (menu->prompt) {
		if (menu->active.page_rows > 1) {
			menu->active.page_rows--;
		} else {
			int offset = strlen(menu->prompt) + 2;
			menu->active.col += offset;
			menu->active.width -= offset;
		}
	}

	return (menu->active.width > 0 && menu->active.page_rows > 0);
}